

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16_range.cc
# Opt level: O1

void re2c::UTF16addContinuous1(RangeSuffix **root,uint32_t l,uint32_t h)

{
  RangeSuffix *pRVar1;
  RangeSuffix *pRVar2;
  RangeSuffix *local_28;
  
  pRVar2 = *root;
  if (*root != (RangeSuffix *)0x0) {
    do {
      pRVar1 = pRVar2;
      if ((pRVar1->l == l) && (pRVar1->h == h)) {
        return;
      }
      pRVar2 = pRVar1->next;
    } while (pRVar1->next != (RangeSuffix *)0x0);
    root = &pRVar1->next;
  }
  pRVar2 = (RangeSuffix *)operator_new(0x18);
  pRVar2->l = l;
  pRVar2->h = h;
  pRVar2->next = (RangeSuffix *)0x0;
  pRVar2->child = (RangeSuffix *)0x0;
  local_28 = pRVar2;
  std::
  _Rb_tree<re2c::RangeSuffix*,re2c::RangeSuffix*,std::_Identity<re2c::RangeSuffix*>,std::less<re2c::RangeSuffix*>,std::allocator<re2c::RangeSuffix*>>
  ::_M_insert_unique<re2c::RangeSuffix*>
            ((_Rb_tree<re2c::RangeSuffix*,re2c::RangeSuffix*,std::_Identity<re2c::RangeSuffix*>,std::less<re2c::RangeSuffix*>,std::allocator<re2c::RangeSuffix*>>
              *)RangeSuffix::freeList,&local_28);
  *root = pRVar2;
  return;
}

Assistant:

void UTF16addContinuous1(RangeSuffix * & root, uint32_t l, uint32_t h)
{
	RangeSuffix ** p = &root;
	for (;;)
	{
		if (*p == NULL)
		{
			*p = new RangeSuffix(l, h);
			break;
		}
		else if ((*p)->l == l && (*p)->h == h)
		{
			break;
		}
		else
			p = &(*p)->next;
	}
}